

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int ixmlNode_isAncestor(IXML_Node_conflict *ancestorNode,IXML_Node_conflict *toFind)

{
  int iVar1;
  
  while( true ) {
    if (ancestorNode == (Nodeptr_conflict)0x0) {
      return 0;
    }
    if (toFind->parentNode == ancestorNode) break;
    iVar1 = ixmlNode_isAncestor(ancestorNode->firstChild,toFind);
    if (iVar1 != 0) {
      return iVar1;
    }
    ancestorNode = ancestorNode->nextSibling;
  }
  return 1;
}

Assistant:

static int ixmlNode_isAncestor(
	/*! [in] The candidate to ancestor \b Node. */
	IXML_Node *ancestorNode,
	/*! [in] The \b Node to check for an ancestor. */
	IXML_Node *toFind)
{
	int found = 0;

	if (ancestorNode != NULL && toFind != NULL) {
		if (toFind->parentNode == ancestorNode) {
			return 1;
		} else {
			found = ixmlNode_isAncestor(
				ancestorNode->firstChild, toFind);
			if (found == 0) {
				found = ixmlNode_isAncestor(
					ancestorNode->nextSibling, toFind);
			}
		}
	}

	return found;
}